

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

ssize_t __thiscall
vm_httpreq_cookie::send(vm_httpreq_cookie *this,int __fd,void *__buf,size_t __n,int __flags)

{
  char *pcVar1;
  ssize_t sVar2;
  void *pvVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  TadsServerThread *this_00;
  
  this_00 = (TadsServerThread *)CONCAT44(in_register_00000034,__fd);
  sVar2 = TadsServerThread::send(this_00,0x2cecca,(void *)0xc,__n,__flags);
  uVar4 = 0;
  if ((int)sVar2 != 0) {
    pcVar1 = this->name;
    pvVar3 = (void *)strlen(pcVar1);
    sVar2 = TadsServerThread::send(this_00,(int)pcVar1,pvVar3,__n,__flags);
    if ((int)sVar2 != 0) {
      sVar2 = TadsServerThread::send(this_00,0x2fbd22,(void *)0x1,__n,__flags);
      if ((int)sVar2 != 0) {
        pcVar1 = this->val;
        pvVar3 = (void *)strlen(pcVar1);
        sVar2 = TadsServerThread::send(this_00,(int)pcVar1,pvVar3,__n,__flags);
        uVar4 = 0;
        if ((int)sVar2 != 0) {
          sVar2 = TadsServerThread::send(this_00,0x2cee49,(void *)0x2,__n,__flags);
          uVar4 = (ulong)((int)sVar2 != 0);
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int vm_httpreq_cookie::send(TadsServerThread *t)
{
    /* send the Set-Cookie header */
    return (t->send("Set-Cookie: ")
            && t->send(name)
            && t->send("=")
            && t->send(val)
            && t->send("\r\n"));
}